

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_font_glyph * nk_font_find_glyph(nk_font *font,nk_rune unicode)

{
  nk_font_glyph *pnVar1;
  nk_font_config *pnVar2;
  nk_rune *range;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  nk_font_config *pnVar7;
  nk_font_glyph *pnVar8;
  
  if ((font == (nk_font *)0x0) || (pnVar1 = font->glyphs, pnVar1 == (nk_font_glyph *)0x0)) {
    pnVar8 = (nk_font_glyph *)0x0;
  }
  else {
    pnVar8 = font->fallback;
    pnVar2 = font->config;
    iVar6 = 0;
    pnVar7 = pnVar2;
    do {
      range = pnVar7->range;
      uVar3 = nk_range_count(range);
      uVar4 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar4 = 0;
      }
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        uVar3 = range[uVar5 * 2];
        if ((uVar3 <= unicode) && (unicode <= range[uVar5 * 2 + 1])) {
          return pnVar1 + ((iVar6 + unicode) - uVar3);
        }
        iVar6 = (iVar6 - uVar3) + range[uVar5 * 2 + 1] + 1;
      }
      pnVar7 = pnVar7->n;
    } while (pnVar7 != pnVar2);
  }
  return pnVar8;
}

Assistant:

NK_API const struct nk_font_glyph*
nk_font_find_glyph(struct nk_font *font, nk_rune unicode)
{
int i = 0;
int count;
int total_glyphs = 0;
const struct nk_font_glyph *glyph = 0;
const struct nk_font_config *iter = 0;

NK_ASSERT(font);
NK_ASSERT(font->glyphs);
NK_ASSERT(font->info.ranges);
if (!font || !font->glyphs) return 0;

glyph = font->fallback;
iter = font->config;
do {count = nk_range_count(iter->range);
for (i = 0; i < count; ++i) {
nk_rune f = iter->range[(i*2)+0];
nk_rune t = iter->range[(i*2)+1];
int diff = (int)((t - f) + 1);
if (unicode >= f && unicode <= t)
return &font->glyphs[((nk_rune)total_glyphs + (unicode - f))];
total_glyphs += diff;
}
} while ((iter = iter->n) != font->config);
return glyph;
}